

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tst_xmlmodelserialiser.cpp
# Opt level: O3

void * __thiscall tst_XmlModelSerialiser::qt_metacast(tst_XmlModelSerialiser *this,char *_clname)

{
  int iVar1;
  void *pvVar2;
  
  if (_clname == (char *)0x0) {
    this = (tst_XmlModelSerialiser *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_meta_stringdata_tst_XmlModelSerialiser.stringdata0);
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"tst_SerialiserCommon");
      if (iVar1 != 0) {
        pvVar2 = (void *)QObject::qt_metacast((char *)this);
        return pvVar2;
      }
      this = (tst_XmlModelSerialiser *)&this->super_tst_SerialiserCommon;
    }
  }
  return this;
}

Assistant:

void *tst_XmlModelSerialiser::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_meta_stringdata_tst_XmlModelSerialiser.stringdata0))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "tst_SerialiserCommon"))
        return static_cast< tst_SerialiserCommon*>(this);
    return QObject::qt_metacast(_clname);
}